

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.c
# Opt level: O3

lws_mqtt_stateful_primitive_return_t lws_mqtt_str_parse(lws_mqtt_str_t *s,uint8_t **in,size_t *len)

{
  ushort uVar1;
  uint16_t uVar2;
  uint uVar3;
  lws_mqtt_stateful_primitive_return_t lVar4;
  uint8_t *puVar5;
  byte *pbVar6;
  ushort uVar7;
  ulong size;
  uint uVar8;
  size_t sVar9;
  byte *pbVar10;
  
  pbVar6 = *in;
  sVar9 = *len;
  if (sVar9 == 0) {
    sVar9 = 0;
    pbVar10 = pbVar6;
  }
  else {
    do {
      if (s->len_valid != '\0') {
        uVar3 = *(int *)&s->len - (uint)s->pos;
        uVar8 = (uint)sVar9;
        if ((uVar3 & 0xffff) <= sVar9) {
          uVar8 = uVar3;
        }
        memcpy(s->buf + s->pos,*in,(ulong)(uVar8 & 0xffff));
        puVar5 = *in;
        *in = puVar5 + (uVar8 & 0xffff);
        s->pos = s->pos + (short)uVar8;
        sVar9 = *len;
        pbVar10 = puVar5 + (uVar8 & 0xffff);
        goto LAB_0011a5d1;
      }
      uVar1 = s->pos;
      pbVar10 = *in;
      if (1 < uVar1) goto LAB_0011a5d1;
      uVar8._0_2_ = s->len;
      uVar8._2_2_ = s->limit;
      pbVar6 = pbVar10 + 1;
      *in = pbVar6;
      size = (ulong)((uVar8 & 0xff) << 8) | (ulong)*pbVar10;
      uVar7 = (ushort)size;
      s->len = uVar7;
      sVar9 = sVar9 - 1;
      *len = sVar9;
      uVar2 = uVar1 + 1;
      s->pos = uVar2;
      if (uVar2 == 2) {
        if (s->limit < uVar7) {
          return LMSPR_FAILED_OVERSIZE;
        }
        s->pos = 0;
        s->len_valid = '\x01';
        if (uVar7 == 0) {
          return LMSPR_COMPLETED;
        }
        if (s->buf == (uint8_t *)0x0) {
          puVar5 = (uint8_t *)lws_realloc((void *)0x0,size,"lws_mqtt_str_parse");
          s->buf = puVar5;
          if (puVar5 == (uint8_t *)0x0) {
            return LMSPR_FAILED_OOM;
          }
          s->needs_freeing = '\x01';
          sVar9 = *len;
        }
      }
    } while (sVar9 != 0);
    sVar9 = 0;
    pbVar10 = *in;
  }
LAB_0011a5d1:
  *len = (size_t)(pbVar6 + (sVar9 - (long)pbVar10));
  if (s->buf == (uint8_t *)0x0) {
    lVar4 = LMSPR_NEED_MORE;
  }
  else {
    lVar4 = (lws_mqtt_stateful_primitive_return_t)(s->pos != s->len);
  }
  return lVar4;
}

Assistant:

lws_mqtt_stateful_primitive_return_t
lws_mqtt_str_parse(lws_mqtt_str_t *s, const uint8_t **in, size_t *len)
{
	const uint8_t *oin = *in;

	/* handle the length + allocation if needed */
	while (*len && !s->len_valid && s->pos < 2) {
		s->len = (s->len << 8) | *((*in)++);
		(*len)--;
		oin = *in;
		if (++s->pos == 2) {
			if (s->len > s->limit)
				return LMSPR_FAILED_OVERSIZE;

			s->pos = 0;
			s->len_valid = 1;

			if (!s->len) /* do not need to allocate */
				return LMSPR_COMPLETED;

			if (!s->buf) {
				s->buf = lws_malloc(s->len, __func__);
				if (!s->buf)
					return LMSPR_FAILED_OOM;

				s->needs_freeing = 1;
			}
		}
	}

	/* handle copying bulk data into allocation */
	if (s->len_valid && *len) {
		uint16_t span = s->len - s->pos;

		if (span > *len)
			span = *len;

		memcpy(s->buf + s->pos, *in, span);
		*in += span;
		s->pos += span;
	}

	*len -= *in - oin;

	return s->buf && s->pos == s->len ? LMSPR_COMPLETED : LMSPR_NEED_MORE;
}